

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O3

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,string_view brokerName,string_view argString)

{
  undefined8 this_00;
  ParseOutput PVar1;
  pointer *__ptr;
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._8_8_ = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_68._8_8_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name,brokerName._M_str,brokerName._M_str + brokerName._M_len);
  local_68._16_8_ = &this->name;
  generateParser((BrokerApp *)local_68,SUB81(this,0));
  this_00 = local_68._0_8_;
  *(CoreType *)(local_68._0_8_ + 0x398) = ctype;
  *(bool *)(local_68._0_8_ + 0x361) = true;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_68 + 0x18),argString._M_str,argString._M_str + argString._M_len);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string>
                    ((helicsCLI11App *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_68 + 0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)local_68);
  }
  if ((tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)local_68._0_8_
      != (_Head_base<0UL,_helics::helicsCLI11App_*,_false>)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::string_view brokerName, std::string_view argString):
    name(brokerName)
{
    auto app = generateParser(ctype == CoreType::MULTI);
    app->setDefaultCoreType(ctype);
    app->passConfig = true;
    if (app->helics_parse(std::string(argString)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}